

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wmb.cpp
# Opt level: O2

void __thiscall merlin::wmb::match_clusters(wmb *this,size_t x,double step)

{
  double dVar1;
  unsigned_long uVar2;
  findex a;
  pointer pmVar3;
  pointer puVar4;
  findex *pfVar5;
  long lVar6;
  size_type __n;
  long lVar7;
  reference rVar8;
  vector<merlin::factor,_std::allocator<merlin::factor>_> ftmp;
  variable VX;
  variable_set var;
  factor fmatch;
  factor bel;
  vector<merlin::factor,_std::allocator<merlin::factor>_> local_1b0;
  variable local_198;
  variable_set local_188;
  factor local_150;
  factor local_f0;
  factor local_90;
  
  pmVar3 = (this->m_clusters).
           super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (8 < (ulong)((long)*(pointer *)
                         ((long)&pmVar3[x].super_my_vector<unsigned_long>.
                                 super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_> +
                         8) -
                 *(long *)&pmVar3[x].super_my_vector<unsigned_long>.
                           super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)) {
    dVar1 = (this->super_graphical_model).m_dims.super__Vector_base<double,_std::allocator<double>_>
            ._M_impl.super__Vector_impl_data._M_start[x];
    local_198.m_states = (size_t)dVar1;
    local_198.m_states =
         (long)(dVar1 - 9.223372036854776e+18) & (long)local_198.m_states >> 0x3f |
         local_198.m_states;
    local_198.m_label = x;
    rVar8 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->m_var_types,x);
    pmVar3 = (this->m_clusters).
             super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar6 = (long)*(pointer *)
                   ((long)&pmVar3[x].super_my_vector<unsigned_long>.
                           super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_> + 8) -
            *(long *)&pmVar3[x].super_my_vector<unsigned_long>.
                      super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>;
    __n = lVar6 >> 3;
    if ((*rVar8._M_p & rVar8._M_mask) == 0) {
      std::vector<merlin::factor,_std::allocator<merlin::factor>_>::vector
                (&local_1b0,__n,(allocator_type *)&local_150);
      local_188.m_dlocal.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_188.m_dlocal.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_188.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_188.m_dlocal.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_188.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_188.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_188.m_d = (vsize *)0x0;
      variable_set::operator|=(&local_188,&local_198);
      factor::factor(&local_150,&local_188,1.0);
      pmVar3 = (this->m_clusters).
               super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar6 = 0;
      for (pfVar5 = *(findex **)
                     &pmVar3[x].super_my_vector<unsigned_long>.
                      super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>;
          pfVar5 != *(pointer *)
                     ((long)&pmVar3[x].super_my_vector<unsigned_long>.
                             super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_> + 8);
          pfVar5 = pfVar5 + 1) {
        a = *pfVar5;
        calc_belief(&local_f0,this,a);
        factor::binaryOpIP<merlin::factor::binOpPower>
                  (SUB84(1.0 / (this->m_weights).super__Vector_base<double,_std::allocator<double>_>
                               ._M_impl.super__Vector_impl_data._M_start[a],0),&local_f0);
        factor::marginal(&local_90,&local_f0,&local_188);
        factor::operator=((factor *)
                          ((long)&(local_1b0.
                                   super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->_vptr_factor + lVar6)
                          ,&local_90);
        factor::~factor(&local_90);
        factor::binaryOp<merlin::factor::binOpPower>
                  (SUB84((this->m_weights).super__Vector_base<double,_std::allocator<double>_>.
                         _M_impl.super__Vector_impl_data._M_start[a],0),&local_90,
                   (long)&(local_1b0.
                           super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>.
                           _M_impl.super__Vector_impl_data._M_start)->_vptr_factor + lVar6);
        factor::binaryOpIP<merlin::factor::binOpTimes>(&local_150,&local_90);
        factor::~factor(&local_90);
        factor::~factor(&local_f0);
        pmVar3 = (this->m_clusters).
                 super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar6 = lVar6 + 0x60;
      }
      lVar6 = 0;
      for (puVar4 = *(pointer *)
                     &pmVar3[x].super_my_vector<unsigned_long>.
                      super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>;
          puVar4 != *(pointer *)
                     ((long)&pmVar3[x].super_my_vector<unsigned_long>.
                             super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_> + 8);
          puVar4 = puVar4 + 1) {
        uVar2 = *puVar4;
        factor::binaryOp<merlin::factor::binOpDivide>
                  (&local_90,&local_150,
                   (long)&(local_1b0.
                           super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>.
                           _M_impl.super__Vector_impl_data._M_start)->_vptr_factor + lVar6);
        factor::binaryOp<merlin::factor::binOpPower>
                  (SUB84((this->m_weights).super__Vector_base<double,_std::allocator<double>_>.
                         _M_impl.super__Vector_impl_data._M_start[uVar2] * step,0),&local_f0,
                   &local_90);
        factor::binaryOpIP<merlin::factor::binOpTimes>
                  ((this->m_reparam).
                   super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>._M_impl.
                   super__Vector_impl_data._M_start + uVar2,&local_f0);
        factor::~factor(&local_f0);
        factor::~factor(&local_90);
        pmVar3 = (this->m_clusters).
                 super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar6 = lVar6 + 0x60;
      }
    }
    else {
      std::vector<merlin::factor,_std::allocator<merlin::factor>_>::vector
                (&local_1b0,__n,(allocator_type *)&local_150);
      local_188.m_dlocal.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_188.m_dlocal.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_188.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_188.m_dlocal.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_188.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_188.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_188.m_d = (vsize *)0x0;
      variable_set::operator|=(&local_188,&local_198);
      factor::factor(&local_150,&local_188,1.0);
      pmVar3 = (this->m_clusters).
               super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar7 = 0;
      for (pfVar5 = *(findex **)
                     &pmVar3[x].super_my_vector<unsigned_long>.
                      super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>;
          pfVar5 != *(pointer *)
                     ((long)&pmVar3[x].super_my_vector<unsigned_long>.
                             super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_> + 8);
          pfVar5 = pfVar5 + 1) {
        calc_belief(&local_f0,this,*pfVar5);
        factor::maxmarginal(&local_90,&local_f0,&local_188);
        factor::operator=((factor *)
                          ((long)&(local_1b0.
                                   super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->_vptr_factor + lVar7)
                          ,&local_90);
        factor::~factor(&local_90);
        factor::binaryOpIP<merlin::factor::binOpTimes>
                  (&local_150,
                   (long)&(local_1b0.
                           super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>.
                           _M_impl.super__Vector_impl_data._M_start)->_vptr_factor + lVar7);
        factor::~factor(&local_f0);
        pmVar3 = (this->m_clusters).
                 super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar7 = lVar7 + 0x60;
      }
      factor::binaryOpIP<merlin::factor::binOpPower>
                (SUB84(1.0 / (((double)CONCAT44(0x45300000,(int)(lVar6 >> 0x23)) -
                              1.9342813113834067e+25) +
                             ((double)CONCAT44(0x43300000,(int)__n) - 4503599627370496.0)),0),
                 &local_150);
      pmVar3 = (this->m_clusters).
               super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar6 = 0;
      for (puVar4 = *(pointer *)
                     &pmVar3[x].super_my_vector<unsigned_long>.
                      super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>;
          puVar4 != *(pointer *)
                     ((long)&pmVar3[x].super_my_vector<unsigned_long>.
                             super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_> + 8);
          puVar4 = puVar4 + 1) {
        uVar2 = *puVar4;
        factor::binaryOp<merlin::factor::binOpDivide>
                  (&local_f0,&local_150,
                   (long)&(local_1b0.
                           super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>.
                           _M_impl.super__Vector_impl_data._M_start)->_vptr_factor + lVar6);
        factor::binaryOpIP<merlin::factor::binOpTimes>
                  ((this->m_reparam).
                   super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>._M_impl.
                   super__Vector_impl_data._M_start + uVar2,&local_f0);
        factor::~factor(&local_f0);
        pmVar3 = (this->m_clusters).
                 super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar6 = lVar6 + 0x60;
      }
    }
    factor::~factor(&local_150);
    variable_set::~variable_set(&local_188);
    std::vector<merlin::factor,_std::allocator<merlin::factor>_>::~vector(&local_1b0);
  }
  return;
}

Assistant:

void wmb::match_clusters(size_t x, double step) {

	if (m_clusters[x].size() <= 1) {
		return; // no matching
	}

	variable VX = var(x);
	if (m_var_types[x] == true) { // max marginals matching

		size_t R = m_clusters[x].size();
		std::vector<factor> ftmp(R); // compute geometric mean

		variable_set var;
		var |= VX; // on mutual variable (bucket variable)
		factor fmatch(var,1.0);

		size_t i = 0;
		for (flist::const_iterator it = m_clusters[x].begin();
				it != m_clusters[x].end(); ++it, i++) {

			findex a = (*it);
			factor bel = calc_belief(a);
			ftmp[i] = bel.maxmarginal(var); // max-marginal
			fmatch *= ftmp[i];
		}

		i = 0;
		fmatch ^= (1.0/R); // and match each bucket to it
		for (flist::const_iterator it = m_clusters[x].begin();
				it != m_clusters[x].end(); ++it, ++i) {
			findex a = (*it);
			m_reparam[a] *= (fmatch/ftmp[i]);
		}

	} else { // weighted marginals matching

		size_t R = m_clusters[x].size();
		std::vector<factor> ftmp(R);   // compute geometric mean

		variable_set var;
		var |= VX; // on mutual variable (bucket variable)
		factor fmatch(var,1.0);
		size_t i = 0;

		for (flist::const_iterator it = m_clusters[x].begin();
				it != m_clusters[x].end(); ++it, i++) {

			findex a = (*it);
			factor bel = calc_belief(a);
			bel ^= (1.0/m_weights[a]);
			ftmp[i] = bel.marginal(var);
			fmatch *= (ftmp[i] ^ m_weights[a]);
		}

		i = 0;
		for (flist::const_iterator it = m_clusters[x].begin();
				it != m_clusters[x].end(); ++it, ++i) {
			findex a = (*it);
			m_reparam[a] *= ((fmatch/ftmp[i])^(step*m_weights[a]));
		}
	}
}